

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O0

RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *
capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::reducePromise
          (RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>
           *__return_storage_ptr__,
          Promise<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
          *promise)

{
  TypeByIndex<0UL,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>
  *t;
  Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_> *promise_00;
  TypeByIndex<1UL,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>
  *t_00;
  Promise<kj::Own<capnp::PipelineHook>_> *promise_01;
  Own<capnp::PipelineHook> local_c0;
  Pipeline local_b0;
  Pipeline local_88;
  PropagateException local_49;
  Promise<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>_>
  local_48;
  undefined1 local_38 [8];
  Tuple<kj::Promise<Response<GetCapResults>_>,_kj::Promise<kj::Own<PipelineHook>_>_> splitPromise;
  Promise<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
  *promise_local;
  
  splitPromise.impl.super_TupleElement<1U,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>.value.
  super_PromiseBase.node.ptr = (PromiseNode *)promise;
  kj::Promise<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>>::
  then<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::reducePromise(kj::Promise<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>>&&)::_lambda(capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>&&)_1_,kj::_::PropagateException>
            ((Promise<capnp::RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>>
              *)&local_48,(Type *)promise,&local_49);
  kj::
  Promise<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>_>
  ::split((SplitTuplePromise<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>_>
           *)local_38,&local_48);
  kj::
  Promise<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>_>
  ::~Promise(&local_48);
  t = kj::
      get<0ul,kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>>,kj::Promise<kj::Own<capnp::PipelineHook>>>&>
                ((Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>
                  *)local_38);
  promise_00 = kj::
               mv<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>>>
                         (t);
  t_00 = kj::
         get<1ul,kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>>,kj::Promise<kj::Own<capnp::PipelineHook>>>&>
                   ((Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>
                     *)local_38);
  promise_01 = kj::mv<kj::Promise<kj::Own<capnp::PipelineHook>>>(t_00);
  newLocalPromisePipeline((capnp *)&local_c0,promise_01);
  AnyPointer::Pipeline::Pipeline(&local_b0,&local_c0);
  capnproto_test::capnp::test::TestPipeline::GetCapResults::Pipeline::Pipeline(&local_88,&local_b0);
  RemotePromise(__return_storage_ptr__,promise_00,&local_88);
  capnproto_test::capnp::test::TestPipeline::GetCapResults::Pipeline::~Pipeline(&local_88);
  AnyPointer::Pipeline::~Pipeline(&local_b0);
  kj::Own<capnp::PipelineHook>::~Own(&local_c0);
  kj::_::
  Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>
  ::~Tuple((Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>
            *)local_38);
  return __return_storage_ptr__;
}

Assistant:

RemotePromise<T> RemotePromise<T>::reducePromise(kj::Promise<RemotePromise>&& promise) {
  kj::Tuple<kj::Promise<Response<T>>, kj::Promise<kj::Own<PipelineHook>>> splitPromise =
      promise.then([](RemotePromise&& inner) {
    // `inner` is multiply-inherited, and we want to move away each superclass separately.
    // Let's create two references to make clear what we're doing (though this is not strictly
    // necessary).
    kj::Promise<Response<T>>& innerPromise = inner;
    typename T::Pipeline& innerPipeline = inner;
    return kj::tuple(kj::mv(innerPromise), PipelineHook::from(kj::mv(innerPipeline)));
  }).split();

  return RemotePromise(kj::mv(kj::get<0>(splitPromise)),
      typename T::Pipeline(AnyPointer::Pipeline(
          newLocalPromisePipeline(kj::mv(kj::get<1>(splitPromise))))));
}